

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

uint Abc_NtkPowerCriticalEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float Limit,Vec_Int_t *vProbs)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = (long)(pNode->vFanins).nSize;
  if (0 < lVar3) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar4 = 1 << ((byte)lVar2 & 0x1f);
      if ((float)vProbs->pArray
                 [*(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]] + 0x10)]
          < Limit) {
        uVar4 = 0;
      }
      uVar1 = uVar1 | uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned Abc_NtkPowerCriticalEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float Limit, Vec_Int_t * vProbs )
{
    Abc_Obj_t * pFanin;
    float * pProb = (float *)vProbs->pArray;
    unsigned uResult = 0;
    int k;
    Abc_ObjForEachFanin( pNode, pFanin, k )
        if ( pProb[pFanin->Id] >= Limit )
            uResult |= (1 << k);
    return uResult;
}